

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

bool __thiscall FIX::DataDictionary::getFieldName(DataDictionary *this,int field,string *name)

{
  DataDictionary *pDVar1;
  DataDictionary *pDVar2;
  DataDictionary *pDVar3;
  
  pDVar2 = this + 0x228;
  pDVar1 = pDVar2;
  for (pDVar3 = *(DataDictionary **)(this + 0x230); pDVar3 != (DataDictionary *)0x0;
      pDVar3 = *(DataDictionary **)(pDVar3 + (ulong)(*(int *)(pDVar3 + 0x20) < field) * 8 + 0x10)) {
    if (field <= *(int *)(pDVar3 + 0x20)) {
      pDVar1 = pDVar3;
    }
  }
  pDVar3 = pDVar2;
  if ((pDVar1 != pDVar2) && (pDVar3 = pDVar1, field < *(int *)(pDVar1 + 0x20))) {
    pDVar3 = pDVar2;
  }
  if (pDVar3 != pDVar2) {
    std::__cxx11::string::_M_assign((string *)name);
  }
  return pDVar3 != pDVar2;
}

Assistant:

bool getFieldName(int field, std::string &name) const {
    FieldToName::const_iterator i = m_fieldNames.find(field);
    if (i == m_fieldNames.end()) {
      return false;
    }
    name = i->second;
    return true;
  }